

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scattering.h
# Opt level: O1

Float __thiscall
pbrt::TrowbridgeReitzDistribution::D(TrowbridgeReitzDistribution *this,Vector3f *wm)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  bool bVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  fVar1 = (wm->super_Tuple3<pbrt::Vector3,_float>).z;
  fVar1 = fVar1 * fVar1;
  auVar14 = ZEXT816(0) << 0x40;
  auVar6 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar1)),auVar14);
  fVar11 = auVar6._0_4_;
  if ((ABS(fVar11 / fVar1) != INFINITY) && (1e-16 <= fVar1 * fVar1)) {
    uVar2 = (wm->super_Tuple3<pbrt::Vector3,_float>).x;
    uVar4 = (wm->super_Tuple3<pbrt::Vector3,_float>).y;
    if (fVar11 < 0.0) {
      fVar12 = sqrtf(fVar11);
    }
    else {
      auVar6 = vsqrtss_avx(auVar6,auVar6);
      fVar12 = auVar6._0_4_;
    }
    fVar9 = 1.0;
    if ((fVar12 != 0.0) || (NAN(fVar12))) {
      auVar14._0_4_ = (float)uVar2 / fVar12;
      auVar14._4_4_ = uVar4;
      auVar14._8_8_ = 0;
      auVar6 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar14);
      uVar7 = vcmpss_avx512f(auVar14,SUB6416(ZEXT464(0xbf800000),0),1);
      bVar8 = (bool)((byte)uVar7 & 1);
      fVar9 = (float)((uint)bVar8 * -0x40800000 + (uint)!bVar8 * auVar6._0_4_);
    }
    fVar12 = this->alpha_x;
    uVar3 = (wm->super_Tuple3<pbrt::Vector3,_float>).x;
    uVar5 = (wm->super_Tuple3<pbrt::Vector3,_float>).y;
    auVar16._4_4_ = uVar5;
    auVar16._0_4_ = uVar3;
    auVar16._8_8_ = 0;
    fVar13 = (wm->super_Tuple3<pbrt::Vector3,_float>).z;
    auVar6 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar13 * fVar13)),ZEXT816(0) << 0x40);
    if (auVar6._0_4_ < 0.0) {
      fVar13 = sqrtf(auVar6._0_4_);
    }
    else {
      auVar6 = vsqrtss_avx(auVar6,auVar6);
      fVar13 = auVar6._0_4_;
    }
    fVar10 = 0.0;
    if ((fVar13 != 0.0) || (NAN(fVar13))) {
      auVar6 = vmovshdup_avx(auVar16);
      auVar15._0_4_ = auVar6._0_4_ / fVar13;
      auVar15._4_12_ = auVar6._4_12_;
      auVar6 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar15);
      uVar7 = vcmpss_avx512f(auVar15,SUB6416(ZEXT464(0xbf800000),0),1);
      bVar8 = (bool)((byte)uVar7 & 1);
      fVar10 = (float)((uint)bVar8 * -0x40800000 + (uint)!bVar8 * auVar6._0_4_);
    }
    fVar13 = this->alpha_y;
    fVar11 = ((fVar9 * fVar9) / (fVar12 * fVar12) + (fVar10 * fVar10) / (fVar13 * fVar13)) *
             (fVar11 / fVar1) + 1.0;
    auVar14 = ZEXT416((uint)(1.0 / (fVar13 * this->alpha_x * 3.1415927 * fVar1 * fVar1 *
                                   fVar11 * fVar11)));
  }
  return auVar14._0_4_;
}

Assistant:

PBRT_CPU_GPU inline Float D(const Vector3f &wm) const {
        Float tan2Theta = Tan2Theta(wm);
        if (IsInf(tan2Theta))
            return 0;
        Float cos4Theta = Cos2Theta(wm) * Cos2Theta(wm);
        if (cos4Theta < 1e-16f)
            return 0;
        Float e =
            tan2Theta * (Sqr(CosPhi(wm)) / Sqr(alpha_x) + Sqr(SinPhi(wm)) / Sqr(alpha_y));
        return 1 / (Pi * alpha_x * alpha_y * cos4Theta * Sqr(1 + e));
    }